

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::reserve_for_insert
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,size_t size)

{
  size_t num_buckets_00;
  table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *this_00;
  ulong in_RSI;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_RDI;
  size_t num_buckets;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_stack_00000020;
  size_t in_stack_ffffffffffffffc8;
  size_t *__a;
  size_t local_18;
  unsigned_long local_10 [2];
  
  if (in_RDI->buckets_ == (bucket_pointer)0x0) {
    __a = &in_RDI->bucket_count_;
    local_18 = min_buckets_for_size(in_RDI,(size_t)__a);
    std::max<unsigned_long>(__a,&local_18);
    create_buckets(in_stack_00000020,num_buckets);
  }
  else if (in_RDI->max_load_ < in_RSI) {
    num_buckets_00 = in_RDI->size_ + (in_RDI->size_ >> 1);
    std::max<unsigned_long>(local_10,(unsigned_long *)&stack0xffffffffffffffd8);
    this_00 = (table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
               *)min_buckets_for_size(in_RDI,in_stack_ffffffffffffffc8);
    if (this_00 !=
        (table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
         *)in_RDI->bucket_count_) {
      table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
      ::rehash_impl(this_00,num_buckets_00);
    }
  }
  return;
}

Assistant:

inline void table<Types>::reserve_for_insert(std::size_t size)
    {
        if (!buckets_) {
            create_buckets((std::max)(bucket_count_,
                min_buckets_for_size(size)));
        }
        // According to the standard this should be 'size >= max_load_',
        // but I think this is better, defect report filed.
        else if(size > max_load_) {
            std::size_t num_buckets
                = min_buckets_for_size((std::max)(size,
                    size_ + (size_ >> 1)));

            if (num_buckets != bucket_count_)
                static_cast<table_impl*>(this)->rehash_impl(num_buckets);
        }
    }